

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O0

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference name;
  const_reference pvVar4;
  char *pcVar5;
  int64_t iVar6;
  string *text;
  ulong uVar7;
  string *w;
  char *fmt;
  char buffer [1024];
  allocator<char> local_309;
  string local_308;
  undefined1 local_2e8 [8];
  cmExprParserHelper helper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string error_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  string error_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string error;
  string argument;
  string option;
  undefined1 local_98 [8];
  string messageHint;
  NumericFormat outputFormat;
  size_t argumentIndex;
  string *expression;
  string *outputVariable;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMathCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((sVar3 != 3) &&
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20), sVar3 != 5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EXPR called with incorrect arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_002ba0d9;
  }
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_20,2);
  messageHint.field_2._12_4_ = 0;
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"ERROR");
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (3 < sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"sub-command EXPR ",
               (allocator<char> *)(option.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(option.field_2._M_local_buf + 0xf));
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,3);
    std::__cxx11::string::string((string *)(argument.field_2._M_local_buf + 8),(string *)pvVar4);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&argument.field_2 + 8),"OUTPUT_FORMAT");
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar3 < 5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&error_2.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"missing argument for option \"");
        std::operator+(&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&error_2.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&argument.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1c8,"\".");
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)(error_2.field_2._M_local_buf + 8));
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        this_local._7_1_ = 0;
        error_1.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,4);
        std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8),(string *)pvVar4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&error.field_2 + 8),"DECIMAL");
        if (bVar1) {
          messageHint.field_2._12_4_ = 1;
LAB_002b9c29:
          error_1.field_2._12_4_ = 0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&error.field_2 + 8),"HEXADECIMAL");
          if (bVar1) {
            messageHint.field_2._12_4_ = 2;
            goto LAB_002b9c29;
          }
          std::operator+(&local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"value \"");
          std::operator+(&local_160,&local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&error.field_2 + 8));
          std::operator+(&local_140,&local_160,"\" for option \"");
          std::operator+(&local_120,&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&argument.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_120,"\" is invalid.");
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
          this_local._7_1_ = 0;
          error_1.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_100);
        }
        std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
        if (error_1.field_2._12_4_ == 0) {
          error_1.field_2._12_4_ = 0;
        }
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&helper.WarningString.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "option \"");
      std::operator+(&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&helper.WarningString.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&argument.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_228,"\" is unknown.");
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)(helper.WarningString.field_2._M_local_buf + 8));
      cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
      this_local._7_1_ = 0;
      error_1.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_208);
    }
    std::__cxx11::string::~string((string *)(argument.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_98);
    if (error_1.field_2._12_4_ != 0) goto LAB_002ba0d9;
  }
  if (messageHint.field_2._12_4_ == 0) {
    messageHint.field_2._12_4_ = 1;
  }
  cmExprParserHelper::cmExprParserHelper((cmExprParserHelper *)local_2e8);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar2 = cmExprParserHelper::ParseString((cmExprParserHelper *)local_2e8,pcVar5,0);
  if (iVar2 == 0) {
    pcVar5 = cmExprParserHelper::GetError((cmExprParserHelper *)local_2e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,pcVar5,&local_309);
    cmCommand::SetError(&this->super_cmCommand,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    this_local._7_1_ = 0;
  }
  else {
    if ((messageHint.field_2._12_4_ == 1) || (messageHint.field_2._12_4_ != 2)) {
      w = (string *)0x85ced9;
    }
    else {
      w = (string *)0x83d3fc;
    }
    iVar6 = cmExprParserHelper::GetResult((cmExprParserHelper *)local_2e8);
    sprintf((char *)&fmt,(char *)w,iVar6);
    text = cmExprParserHelper::GetWarning_abi_cxx11_((cmExprParserHelper *)local_2e8);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,text);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,(char *)&fmt);
    this_local._7_1_ = 1;
  }
  error_1.field_2._12_4_ = 1;
  cmExprParserHelper::~cmExprParserHelper((cmExprParserHelper *)local_2e8);
LAB_002ba0d9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if ((args.size() != 3) && (args.size() != 5)) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  enum class NumericFormat
  {
    UNINITIALIZED,
    DECIMAL,
    HEXADECIMAL,
  };

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];
  size_t argumentIndex = 3;
  NumericFormat outputFormat = NumericFormat::UNINITIALIZED;

  this->Makefile->AddDefinition(outputVariable, "ERROR");

  if (argumentIndex < args.size()) {
    const std::string messageHint = "sub-command EXPR ";
    const std::string option = args[argumentIndex++];
    if (option == "OUTPUT_FORMAT") {
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "DECIMAL") {
          outputFormat = NumericFormat::DECIMAL;
        } else if (argument == "HEXADECIMAL") {
          outputFormat = NumericFormat::HEXADECIMAL;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }

  if (outputFormat == NumericFormat::UNINITIALIZED) {
    outputFormat = NumericFormat::DECIMAL;
  }

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    this->SetError(helper.GetError());
    return false;
  }

  char buffer[1024];
  const char* fmt;
  switch (outputFormat) {
    case NumericFormat::HEXADECIMAL:
      fmt = "0x%" KWIML_INT_PRIx64;
      break;
    case NumericFormat::DECIMAL:
      CM_FALLTHROUGH;
    default:
      fmt = "%" KWIML_INT_PRId64;
      break;
  }
  sprintf(buffer, fmt, helper.GetResult());

  std::string const& w = helper.GetWarning();
  if (!w.empty()) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w);
  }

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}